

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.h
# Opt level: O0

size_t BIT_lookBits(BIT_DStream_t *bitD,U32 nbBits)

{
  size_t sVar1;
  U32 nbBits_local;
  BIT_DStream_t *bitD_local;
  
  sVar1 = BIT_getMiddleBits(bitD->bitContainer,(0x40 - bitD->bitsConsumed) - nbBits,nbBits);
  return sVar1;
}

Assistant:

MEM_STATIC size_t BIT_lookBits(const BIT_DStream_t* bitD, U32 nbBits)
{
    /* arbitrate between double-shift and shift+mask */
#if 1
    /* if bitD->bitsConsumed + nbBits > sizeof(bitD->bitContainer)*8,
     * bitstream is likely corrupted, and result is undefined */
    return BIT_getMiddleBits(bitD->bitContainer, (sizeof(bitD->bitContainer)*8) - bitD->bitsConsumed - nbBits, nbBits);
#else
    /* this code path is slower on my os-x laptop */
    U32 const regMask = sizeof(bitD->bitContainer)*8 - 1;
    return ((bitD->bitContainer << (bitD->bitsConsumed & regMask)) >> 1) >> ((regMask-nbBits) & regMask);
#endif
}